

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigDup.c
# Opt level: O0

Aig_Man_t * Aig_ManDupOneOutput(Aig_Man_t *p,int iPoNum,int fAddRegs)

{
  int iVar1;
  int iVar2;
  Aig_Man_t *p_00;
  char *pcVar3;
  Aig_Obj_t *pAVar4;
  Aig_Obj_t *pAVar5;
  void *pvVar6;
  Aig_Obj_t *p1;
  int local_50;
  int local_4c;
  int local_2c;
  int i;
  Aig_Obj_t *pObj;
  Aig_Man_t *pNew;
  int fAddRegs_local;
  int iPoNum_local;
  Aig_Man_t *p_local;
  
  iVar1 = Aig_ManRegNum(p);
  if (iVar1 < 1) {
    __assert_fail("Aig_ManRegNum(p) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x485,"Aig_Man_t *Aig_ManDupOneOutput(Aig_Man_t *, int, int)");
  }
  iVar1 = Aig_ManCoNum(p);
  iVar2 = Aig_ManRegNum(p);
  if (iVar1 - iVar2 <= iPoNum) {
    __assert_fail("iPoNum < Aig_ManCoNum(p)-Aig_ManRegNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigDup.c"
                  ,0x486,"Aig_Man_t *Aig_ManDupOneOutput(Aig_Man_t *, int, int)");
  }
  iVar1 = Aig_ManObjNumMax(p);
  p_00 = Aig_ManStart(iVar1);
  pcVar3 = Abc_UtilStrsav(p->pName);
  p_00->pName = pcVar3;
  pcVar3 = Abc_UtilStrsav(p->pSpec);
  p_00->pSpec = pcVar3;
  Aig_ManCleanData(p);
  pAVar4 = Aig_ManConst1(p_00);
  pAVar5 = Aig_ManConst1(p);
  (pAVar5->field_5).pData = pAVar4;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vCis), local_2c < iVar1; local_2c = local_2c + 1) {
    pvVar6 = Vec_PtrEntry(p->vCis,local_2c);
    pAVar4 = Aig_ObjCreateCi(p_00);
    *(Aig_Obj_t **)((long)pvVar6 + 0x28) = pAVar4;
  }
  if (fAddRegs == 0) {
    local_4c = 0;
  }
  else {
    local_4c = p->nRegs;
  }
  p_00->nRegs = local_4c;
  if (fAddRegs == 0) {
    local_50 = p->nTruePis + p->nRegs;
  }
  else {
    local_50 = p->nTruePis;
  }
  p_00->nTruePis = local_50;
  p_00->nTruePos = 1;
  for (local_2c = 0; iVar1 = Vec_PtrSize(p->vObjs), local_2c < iVar1; local_2c = local_2c + 1) {
    pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vObjs,local_2c);
    if ((pAVar4 != (Aig_Obj_t *)0x0) && (iVar1 = Aig_ObjIsNode(pAVar4), iVar1 != 0)) {
      pAVar5 = Aig_ObjChild0Copy(pAVar4);
      p1 = Aig_ObjChild1Copy(pAVar4);
      pAVar5 = Aig_And(p_00,pAVar5,p1);
      (pAVar4->field_5).pData = pAVar5;
    }
  }
  pAVar4 = Aig_ManCo(p,iPoNum);
  pAVar4 = Aig_ObjChild0Copy(pAVar4);
  Aig_ObjCreateCo(p_00,pAVar4);
  if (fAddRegs != 0) {
    local_2c = Aig_ManCoNum(p);
    iVar1 = Aig_ManRegNum(p);
    for (local_2c = local_2c - iVar1; iVar1 = Vec_PtrSize(p->vCos), local_2c < iVar1;
        local_2c = local_2c + 1) {
      pAVar4 = (Aig_Obj_t *)Vec_PtrEntry(p->vCos,local_2c);
      pAVar4 = Aig_ObjChild0Copy(pAVar4);
      Aig_ObjCreateCo(p_00,pAVar4);
    }
  }
  Aig_ManCleanup(p_00);
  return p_00;
}

Assistant:

Aig_Man_t * Aig_ManDupOneOutput( Aig_Man_t * p, int iPoNum, int fAddRegs )
{
    Aig_Man_t * pNew;
    Aig_Obj_t * pObj = NULL;
    int i;
    assert( Aig_ManRegNum(p) > 0 );
    assert( iPoNum < Aig_ManCoNum(p)-Aig_ManRegNum(p) );
    // create the new manager
    pNew = Aig_ManStart( Aig_ManObjNumMax(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    // create the PIs
    Aig_ManCleanData( p );
    Aig_ManConst1(p)->pData = Aig_ManConst1(pNew);
    Aig_ManForEachCi( p, pObj, i )
        pObj->pData = Aig_ObjCreateCi( pNew );
    // set registers
    pNew->nRegs    = fAddRegs? p->nRegs : 0;
    pNew->nTruePis = fAddRegs? p->nTruePis : p->nTruePis + p->nRegs;
    pNew->nTruePos = 1;
    // duplicate internal nodes
    Aig_ManForEachNode( p, pObj, i )
        pObj->pData = Aig_And( pNew, Aig_ObjChild0Copy(pObj), Aig_ObjChild1Copy(pObj) );
    // create the PO
    pObj = Aig_ManCo( p, iPoNum );
    Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    // create register inputs with MUXes
    if ( fAddRegs )
    {
        Aig_ManForEachLiSeq( p, pObj, i )
            Aig_ObjCreateCo( pNew, Aig_ObjChild0Copy(pObj) );
    }
    Aig_ManCleanup( pNew );
    return pNew;
}